

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3Sum_Test::TestBody(VectorsTest_FP3Sum_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FP3 res;
  FP3 v2;
  FP3 v1;
  Vector3<double> *in_stack_fffffffffffffe78;
  Vector3<double> *in_stack_fffffffffffffe80;
  AssertHelper *this_00;
  double *in_stack_fffffffffffffe88;
  AssertionResult *pAVar2;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar3;
  char *in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  char *file;
  undefined8 in_stack_fffffffffffffea8;
  Type TVar4;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 uVar5;
  Vector3<double> *this_01;
  AssertionResult *this_02;
  Vector3<double> local_100;
  AssertionResult local_e8 [2];
  Vector3<double> local_c8;
  AssertionResult local_b0;
  uint local_9c;
  Vector3<double> local_78;
  AssertionResult local_60;
  char local_48 [8];
  AssertHelper local_40;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  pica::Vector3<double>::Vector3(&local_20,3.0,5.0,-2.0);
  pica::Vector3<double>::Vector3(&local_38,6.0,-8.0,2.0);
  pica::operator+(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  this_01 = &local_78;
  pica::Vector3<double>::Vector3(this_01,9.0,-3.0,0.0);
  this_02 = &local_60;
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffffe98,
             (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->x);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1e0672);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),TVar4,
               in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x1e06cf);
  }
  local_9c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e073d);
  if (local_9c == 0) {
    file = local_48;
    pica::Vector3<double>::Vector3(&local_c8,9.0,-3.0,0.0);
    pAVar2 = &local_b0;
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_fffffffffffffe98,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->x);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
    TVar4 = (Type)((ulong)pAVar2 >> 0x20);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffeb0));
      in_stack_fffffffffffffe98 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1e080f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),TVar4,file,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
      testing::Message::~Message((Message *)0x1e086c);
    }
    local_9c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e08da);
    if (local_9c == 0) {
      this_00 = &local_40;
      pica::Vector3<double>::Vector3(&local_100,9.0,-3.0,0.0);
      pAVar2 = local_e8;
      testing::internal::EqHelper<false>::Compare<double,double>
                (in_stack_fffffffffffffe98,
                 (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (double *)pAVar2,(double *)this_00);
      line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
      if (!bVar1) {
        uVar3 = bVar1;
        testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffeb0));
        testing::AssertionResult::failure_message((AssertionResult *)0x1e09ac);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffeb0),TVar4,file,line,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
        testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1e09fe);
      }
      local_9c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0a66);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3Sum)
{
    FP3 v1(3, 5, -2), v2(6, -8, 2);
    FP3 res = v1 + v2;
    ASSERT_EQ_FP3(res, FP3(9, -3, 0));
}